

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O0

void __thiscall
OpenMD::DynamicVector<double,_std::allocator<double>_>::mul
          (DynamicVector<double,_std::allocator<double>_> *this,
          DynamicVector<double,_std::allocator<double>_> *v1,double s)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar1;
  anon_class_8_1_54a39813 in_RDI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> in_XMM0_Qa;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffc0;
  
  __result._M_current = (double *)size((DynamicVector<double,_std::allocator<double>_> *)0x263133);
  pdVar1 = (double *)size((DynamicVector<double,_std::allocator<double>_> *)0x263142);
  if (__result._M_current != pdVar1) {
    size((DynamicVector<double,_std::allocator<double>_> *)0x263159);
    resize((DynamicVector<double,_std::allocator<double>_> *)in_RDI.s,
           (size_type)in_stack_ffffffffffffffa8);
  }
  begin(in_stack_ffffffffffffffa8);
  end(in_stack_ffffffffffffffa8);
  begin(in_stack_ffffffffffffffa8);
  std::
  transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,OpenMD::DynamicVector<double,std::allocator<double>>::mul(OpenMD::DynamicVector<double,std::allocator<double>>const&,double)::_lambda(double)_1_>
            (in_XMM0_Qa,in_stack_ffffffffffffffc0,__result,in_RDI);
  return;
}

Assistant:

void mul(const DynamicVector<Real>& v1, Real s) {
      if (this->size() != v1.size()) this->resize(v1.size());

      std::transform(v1.begin(), v1.end(), this->begin(),
                     [s](Real val) { return val * s; });
    }